

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::uDot(Forth *this)

{
  long lVar1;
  Cell CVar2;
  ostream *poVar3;
  uint uVar4;
  
  requireDStackDepth(this,1,"U.");
  ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if (this->writeToTarget == ToStdCout) {
    CVar2 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
    if (CVar2 == 8) {
      uVar4 = 0x40;
    }
    else if (CVar2 == 10) {
      uVar4 = 2;
    }
    else {
      uVar4 = (uint)(CVar2 == 0x10) << 3;
    }
    *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | uVar4;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    std::ostream::flush();
    return;
  }
  if (this->writeToTarget == ToString) {
    CVar2 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
    lVar1 = *(long *)(*(long *)&this->field_0x20 + -0x18);
    if (CVar2 == 8) {
      uVar4 = 0x40;
    }
    else if (CVar2 == 10) {
      uVar4 = 2;
    }
    else {
      uVar4 = (uint)(CVar2 == 0x10) << 3;
    }
    *(uint *)(&this->field_0x38 + lVar1) = *(uint *)(&this->field_0x38 + lVar1) & 0xffffffb5 | uVar4
    ;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&this->field_0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    return;
  }
  return;
}

Assistant:

void uDot() {
			REQUIRE_DSTACK_DEPTH(1, "U.");
			auto value = static_cast<Cell>(dStack.getTop()); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << value << " ";
				break;
			case ToStdCout:
				std::cout << SETBASE() << value << " ";
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}